

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O1

void irr::executeBlit_TextureCopy_24_to_32(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  u32 uVar3;
  void *pvVar4;
  void *pvVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  pvVar5 = job->dst;
  if (job->stretch == true) {
    uVar3 = job->height;
    if (uVar3 != 0) {
      uVar7 = job->width;
      fVar1 = (float)job->x_stretch;
      fVar2 = (float)job->y_stretch;
      pvVar4 = job->src;
      uVar8 = 0;
      do {
        if ((ulong)uVar7 != 0) {
          uVar10 = (int)(long)((float)uVar8 * fVar2) * job->srcPitch;
          uVar11 = 0;
          do {
            uVar12 = (long)((float)(uVar11 & 0xffffffff) * fVar1 * 3.0) & 0xffffffff;
            *(uint *)((long)pvVar5 + uVar11 * 4) =
                 (uint)*(byte *)((long)pvVar4 + uVar12 + (ulong)uVar10 + 2) |
                 (uint)*(byte *)((long)pvVar4 + uVar12 + (ulong)uVar10 + 1) << 8 |
                 (uint)*(byte *)((long)pvVar4 + uVar12 + uVar10) << 0x10 | 0xff000000;
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
        }
        pvVar5 = (void *)((long)pvVar5 + (ulong)job->dstPitch);
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar3);
    }
  }
  else if (job->height != 0) {
    pbVar6 = (byte *)job->src;
    uVar7 = 0;
    do {
      if (job->width != 0) {
        uVar11 = 0;
        pbVar9 = pbVar6;
        do {
          *(uint *)((long)pvVar5 + uVar11 * 4) =
               (uint)pbVar9[2] | (uint)pbVar9[1] << 8 | (uint)*pbVar9 << 0x10 | 0xff000000;
          pbVar9 = pbVar9 + 3;
          uVar11 = uVar11 + 1;
        } while (uVar11 < job->width);
      }
      pbVar6 = pbVar6 + job->srcPitch;
      pvVar5 = (void *)((long)pvVar5 + (ulong)job->dstPitch);
      uVar7 = uVar7 + 1;
    } while (uVar7 < job->height);
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_24_to_32(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u8 *src = static_cast<const u8 *>(job->src);
	u32 *dst = static_cast<u32 *>(job->dst);

	if (job->stretch) {
		const float wscale = job->x_stretch * 3.f;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (const u8 *)job->src + (job->srcPitch * src_y);

			for (u32 dx = 0; dx < w; ++dx) {
				const u8 *s = src + (u32)(dx * wscale);
				dst[dx] = 0xFF000000 | s[0] << 16 | s[1] << 8 | s[2];
			}
			dst = (u32 *)((u8 *)(dst) + job->dstPitch);
		}
	} else {
		for (u32 dy = 0; dy < job->height; ++dy) {
			const u8 *s = src;

			for (u32 dx = 0; dx < job->width; ++dx) {
				dst[dx] = 0xFF000000 | s[0] << 16 | s[1] << 8 | s[2];
				s += 3;
			}

			src = src + job->srcPitch;
			dst = (u32 *)((u8 *)(dst) + job->dstPitch);
		}
	}
}